

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  detail *end;
  detail *end_00;
  format_handler<char> *handler_00;
  detail *end_01;
  
  handler_00 = (format_handler<char> *)fmt.size_;
  end = this + (long)fmt.data_;
  end_01 = this;
  if (fmt.data_ != (char *)0x0) {
    do {
      end_00 = end_01 + 1;
      if (*end_01 == (detail)0x7d) {
        if ((end_00 == end) || (*end_00 != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                  ((char *)this,(char *)end_00,(handler_00->ctx).out_.container);
        end_00 = end_01 + 2;
        this = end_00;
      }
      else if (*end_01 == (detail)0x7b) {
        copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                  ((char *)this,(char *)end_01,(handler_00->ctx).out_.container);
        end_00 = (detail *)
                 parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>
                           ((char *)end_01,(char *)end,handler_00);
        this = end_00;
      }
      end_01 = end_00;
    } while (end_00 != end);
  }
  copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
            ((char *)this,(char *)end,(handler_00->ctx).out_.container);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}